

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O0

bool __thiscall cmSourceFile::FindFullPath(cmSourceFile *this,string *error)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  string *psVar2;
  ulong uVar3;
  reference pbVar4;
  ostream *poVar5;
  cmMakefile *this_02;
  string local_310;
  string local_2f0 [32];
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2d0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2c8;
  const_iterator ext_1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b8;
  const_iterator ext;
  string missing;
  ostringstream e;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_118;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_110;
  const_iterator ei_1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_100;
  const_iterator ei;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [8];
  string tryPath;
  char **di;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *hdrExts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *srcExts;
  char *tryDirs [3];
  cmMakefile *mf;
  allocator local_41;
  string local_40;
  string *local_20;
  string *error_local;
  cmSourceFile *this_local;
  
  if ((this->FindFullPathFailed & 1U) == 0) {
    local_20 = error;
    error_local = (string *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"GENERATED",&local_41);
    bVar1 = GetPropertyAsBool(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    if (bVar1) {
      cmSourceFileLocation::DirectoryUseBinary(&this->Location);
      psVar2 = cmSourceFileLocation::GetDirectory_abi_cxx11_(&this->Location);
      std::__cxx11::string::operator=((string *)&this->FullPath,(string *)psVar2);
      std::__cxx11::string::operator+=((string *)&this->FullPath,"/");
      psVar2 = cmSourceFileLocation::GetName_abi_cxx11_(&this->Location);
      std::__cxx11::string::operator+=((string *)&this->FullPath,(string *)psVar2);
      this_local._7_1_ = 1;
    }
    else {
      tryDirs[2] = (char *)cmSourceFileLocation::GetMakefile(&this->Location);
      memset(&srcExts,0,0x18);
      bVar1 = cmSourceFileLocation::DirectoryIsAmbiguous(&this->Location);
      if (bVar1) {
        srcExts = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)cmMakefile::GetCurrentSourceDirectory((cmMakefile *)tryDirs[2]);
        tryDirs[0] = cmMakefile::GetCurrentBinaryDirectory((cmMakefile *)tryDirs[2]);
      }
      else {
        srcExts = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x9a61b7;
      }
      this_00 = cmMakefile::GetSourceExtensions_abi_cxx11_((cmMakefile *)tryDirs[2]);
      this_01 = cmMakefile::GetHeaderExtensions_abi_cxx11_((cmMakefile *)tryDirs[2]);
      for (tryPath.field_2._8_8_ = &srcExts; *(long *)tryPath.field_2._8_8_ != 0;
          tryPath.field_2._8_8_ = tryPath.field_2._8_8_ + 8) {
        psVar2 = cmSourceFileLocation::GetDirectory_abi_cxx11_(&this->Location);
        std::__cxx11::string::string((string *)local_b0,(string *)psVar2);
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          std::__cxx11::string::operator+=((string *)local_b0,"/");
        }
        psVar2 = cmSourceFileLocation::GetName_abi_cxx11_(&this->Location);
        std::__cxx11::string::operator+=((string *)local_b0,(string *)psVar2);
        cmsys::SystemTools::CollapseFullPath
                  (&local_d0,(string *)local_b0,*(char **)tryPath.field_2._8_8_);
        std::__cxx11::string::operator=((string *)local_b0,(string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_f0,"",(allocator *)((long)&ei._M_current + 7))
        ;
        bVar1 = TryFullPath(this,(string *)local_b0,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&ei._M_current + 7));
        if (bVar1) {
          this_local._7_1_ = 1;
          ei._M_current._0_4_ = 1;
        }
        else {
          local_100._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this_00);
          while( true ) {
            ei_1 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(this_00);
            bVar1 = __gnu_cxx::operator!=(&local_100,&ei_1);
            if (!bVar1) break;
            pbVar4 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_100);
            bVar1 = TryFullPath(this,(string *)local_b0,pbVar4);
            if (bVar1) {
              this_local._7_1_ = 1;
              ei._M_current._0_4_ = 1;
              goto LAB_005d74b4;
            }
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_100);
          }
          local_110._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this_01);
          while( true ) {
            local_118._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(this_01);
            bVar1 = __gnu_cxx::operator!=(&local_110,&local_118);
            if (!bVar1) break;
            pbVar4 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_110);
            bVar1 = TryFullPath(this,(string *)local_b0,pbVar4);
            if (bVar1) {
              this_local._7_1_ = 1;
              ei._M_current._0_4_ = 1;
              goto LAB_005d74b4;
            }
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_110);
          }
          ei._M_current._0_4_ = 0;
        }
LAB_005d74b4:
        std::__cxx11::string::~string((string *)local_b0);
        if ((int)ei._M_current != 0) goto LAB_005d77eb;
      }
      std::__cxx11::ostringstream::ostringstream
                ((ostringstream *)(missing.field_2._M_local_buf + 8));
      psVar2 = cmSourceFileLocation::GetDirectory_abi_cxx11_(&this->Location);
      std::__cxx11::string::string((string *)&ext,(string *)psVar2);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)&ext,"/");
      }
      psVar2 = cmSourceFileLocation::GetName_abi_cxx11_(&this->Location);
      std::__cxx11::string::operator+=((string *)&ext,(string *)psVar2);
      poVar5 = std::operator<<((ostream *)((long)&missing.field_2 + 8),
                               "Cannot find source file:\n  ");
      poVar5 = std::operator<<(poVar5,(string *)&ext);
      std::operator<<(poVar5,"\nTried extensions");
      local_2b8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
      while( true ) {
        ext_1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(this_00);
        bVar1 = __gnu_cxx::operator!=(&local_2b8,&ext_1);
        if (!bVar1) break;
        poVar5 = std::operator<<((ostream *)((long)&missing.field_2 + 8)," .");
        pbVar4 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_2b8);
        std::operator<<(poVar5,(string *)pbVar4);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_2b8);
      }
      local_2c8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_01);
      while( true ) {
        local_2d0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(this_01);
        bVar1 = __gnu_cxx::operator!=(&local_2c8,&local_2d0);
        if (!bVar1) break;
        poVar5 = std::operator<<((ostream *)((long)&missing.field_2 + 8)," .");
        pbVar4 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_2c8);
        std::operator<<(poVar5,(string *)pbVar4);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_2c8);
      }
      if (local_20 == (string *)0x0) {
        this_02 = cmSourceFileLocation::GetMakefile(&this->Location);
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(this_02,FATAL_ERROR,&local_310);
        std::__cxx11::string::~string((string *)&local_310);
      }
      else {
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=((string *)local_20,local_2f0);
        std::__cxx11::string::~string(local_2f0);
      }
      this->FindFullPathFailed = true;
      this_local._7_1_ = 0;
      ei._M_current._0_4_ = 1;
      std::__cxx11::string::~string((string *)&ext);
      std::__cxx11::ostringstream::~ostringstream
                ((ostringstream *)(missing.field_2._M_local_buf + 8));
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_005d77eb:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmSourceFile::FindFullPath(std::string* error)
{
  // If thie method has already failed once do not try again.
  if(this->FindFullPathFailed)
    {
    return false;
    }

  // If the file is generated compute the location without checking on
  // disk.
  if(this->GetPropertyAsBool("GENERATED"))
    {
    // The file is either already a full path or is relative to the
    // build directory for the target.
    this->Location.DirectoryUseBinary();
    this->FullPath = this->Location.GetDirectory();
    this->FullPath += "/";
    this->FullPath += this->Location.GetName();
    return true;
    }

  // The file is not generated.  It must exist on disk.
  cmMakefile const* mf = this->Location.GetMakefile();
  const char* tryDirs[3] = {0, 0, 0};
  if(this->Location.DirectoryIsAmbiguous())
    {
    tryDirs[0] = mf->GetCurrentSourceDirectory();
    tryDirs[1] = mf->GetCurrentBinaryDirectory();
    }
  else
    {
    tryDirs[0] = "";
    }
  const std::vector<std::string>& srcExts = mf->GetSourceExtensions();
  const std::vector<std::string>& hdrExts = mf->GetHeaderExtensions();
  for(const char* const* di = tryDirs; *di; ++di)
    {
    std::string tryPath = this->Location.GetDirectory();
    if(!tryPath.empty())
      {
      tryPath += "/";
      }
    tryPath += this->Location.GetName();
    tryPath = cmSystemTools::CollapseFullPath(tryPath, *di);
    if(this->TryFullPath(tryPath, ""))
      {
      return true;
      }
    for(std::vector<std::string>::const_iterator ei = srcExts.begin();
        ei != srcExts.end(); ++ei)
      {
      if(this->TryFullPath(tryPath, *ei))
        {
        return true;
        }
      }
    for(std::vector<std::string>::const_iterator ei = hdrExts.begin();
        ei != hdrExts.end(); ++ei)
      {
      if(this->TryFullPath(tryPath, *ei))
        {
        return true;
        }
      }
    }

  std::ostringstream e;
  std::string missing = this->Location.GetDirectory();
  if(!missing.empty())
    {
    missing += "/";
    }
  missing += this->Location.GetName();
  e << "Cannot find source file:\n  " << missing << "\nTried extensions";
  for(std::vector<std::string>::const_iterator ext = srcExts.begin();
      ext != srcExts.end(); ++ext)
    {
    e << " ." << *ext;
    }
  for(std::vector<std::string>::const_iterator ext = hdrExts.begin();
      ext != hdrExts.end(); ++ext)
    {
    e << " ." << *ext;
    }
  if(error)
    {
    *error = e.str();
    }
  else
    {
    this->Location.GetMakefile()->IssueMessage(cmake::FATAL_ERROR, e.str());
    }
  this->FindFullPathFailed = true;
  return false;
}